

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

void google::DumpStackTrace(int skip_count,DebugWriter *writerfn,void *arg)

{
  int iVar1;
  int local_130;
  int i;
  int depth;
  void *stack [32];
  void *arg_local;
  DebugWriter *writerfn_local;
  int skip_count_local;
  
  iVar1 = GetStackTrace((void **)&i,0x20,skip_count + 1);
  for (local_130 = 0; local_130 < iVar1; local_130 = local_130 + 1) {
    if ((fLB::FLAGS_symbolize_stacktrace & 1) == 0) {
      DumpPC(writerfn,arg,*(void **)(&i + (long)local_130 * 2),"    ");
    }
    else {
      DumpPCAndSymbol(writerfn,arg,*(void **)(&i + (long)local_130 * 2),"    ");
    }
  }
  return;
}

Assistant:

static void DumpStackTrace(int skip_count, DebugWriter* writerfn, void* arg) {
  // Print stack trace
  void* stack[32];
  int depth = GetStackTrace(stack, ARRAYSIZE(stack), skip_count + 1);
  for (int i = 0; i < depth; i++) {
#  if defined(HAVE_SYMBOLIZE)
    if (FLAGS_symbolize_stacktrace) {
      DumpPCAndSymbol(writerfn, arg, stack[i], "    ");
    } else {
      DumpPC(writerfn, arg, stack[i], "    ");
    }
#  else
    DumpPC(writerfn, arg, stack[i], "    ");
#  endif
  }
}